

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O0

sexp sexp_finalize_port(sexp ctx,sexp self,sexp_sint_t n,sexp port)

{
  int iVar1;
  long lVar2;
  int *in_RCX;
  undefined8 in_RDX;
  sexp in_RSI;
  sexp in_RDI;
  sexp res;
  sexp in_stack_ffffffffffffffa8;
  sexp in_stack_ffffffffffffffb0;
  sexp in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc4;
  uint uVar3;
  int local_38;
  int local_30;
  
  if ((char)in_RCX[0xc] != '\0') {
    *(undefined1 *)(in_RCX + 0xc) = 0;
    local_30 = in_stack_ffffffffffffffc0;
    if ((((ulong)in_RCX & 3) == 0) && (*in_RCX == 0x11)) {
      if (*(long *)(in_RCX + 10) == 0) {
        fflush(*(FILE **)(in_RCX + 8));
        local_30 = in_stack_ffffffffffffffc0;
      }
      else {
        sexp_buffered_flush(in_RDI,in_RSI,(int)((ulong)in_RDX >> 0x20));
        local_30 = in_stack_ffffffffffffffc0;
      }
    }
    if ((((*(ulong *)(in_RCX + 6) & 3) == 0) && (**(int **)(in_RCX + 6) == 0x12)) &&
       (*(char *)(*(long *)(in_RCX + 6) + 8) != '\0')) {
      if (*(char *)((long)in_RCX + 0x33) != '\0') {
        if ((((ulong)in_RCX & 3) == 0) && (*in_RCX == 0x10)) {
          if (*(long *)(in_RCX + 8) == 0) {
            if (((*(ulong *)(in_RCX + 6) & 3) == 0) && (**(int **)(in_RCX + 6) == 0x12)) {
              local_38 = (int)*(undefined8 *)(*(long *)(in_RCX + 6) + 0x10);
            }
            else {
              local_38 = -1;
            }
            local_30 = local_38;
            uVar3 = in_stack_ffffffffffffffc4;
          }
          else {
            local_30 = fileno(*(FILE **)(in_RCX + 8));
            uVar3 = in_stack_ffffffffffffffc4;
          }
          in_stack_ffffffffffffffc4 = uVar3 & 0xffffff;
          if (((ulong)in_RCX & 3) == 0) {
            in_stack_ffffffffffffffc4 = CONCAT13(*in_RCX == 0x11,(int3)uVar3);
          }
          iVar1 = 0;
          if ((char)(in_stack_ffffffffffffffc4 >> 0x18) != '\0') {
            iVar1 = 2;
          }
          shutdown(local_30,iVar1);
        }
        if ((((ulong)in_RCX & 3) == 0) && (*in_RCX == 0x11)) {
          if (*(long *)(in_RCX + 8) == 0) {
            if (((*(ulong *)(in_RCX + 6) & 3) == 0) && (**(int **)(in_RCX + 6) == 0x12)) {
              in_stack_ffffffffffffffb0 = *(sexp *)(*(long *)(in_RCX + 6) + 0x10);
              in_stack_ffffffffffffffb8 = in_stack_ffffffffffffffb0;
            }
            else {
              in_stack_ffffffffffffffb0 = (sexp)0xffffffffffffffff;
              in_stack_ffffffffffffffb8 = in_stack_ffffffffffffffb0;
            }
          }
          else {
            iVar1 = fileno(*(FILE **)(in_RCX + 8));
            in_stack_ffffffffffffffb8 = (sexp)(long)iVar1;
          }
          shutdown((int)in_stack_ffffffffffffffb8,1);
        }
      }
      if (((char)in_RCX[0xd] == '\0') &&
         (lVar2 = *(long *)(*(long *)(in_RCX + 6) + 0x18) + -1,
         *(long *)(*(long *)(in_RCX + 6) + 0x18) = lVar2, lVar2 == 0)) {
        sexp_finalize_fileno
                  ((sexp)CONCAT44(in_stack_ffffffffffffffc4,local_30),in_stack_ffffffffffffffb8,
                   (sexp_sint_t)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      }
    }
    if ((*(long *)(in_RCX + 8) != 0) && ((char)in_RCX[0xd] == '\0')) {
      fclose(*(FILE **)(in_RCX + 8));
    }
    in_RCX[0xe] = 0;
    in_RCX[0xf] = 0;
    in_RCX[0x14] = 0;
    in_RCX[0x15] = 0;
  }
  return (sexp)&DAT_0000043e;
}

Assistant:

sexp sexp_finalize_port (sexp ctx, sexp self, sexp_sint_t n, sexp port) {
  sexp res = SEXP_VOID;
  if (sexp_port_openp(port)) {
    sexp_port_openp(port) = 0;
    if (sexp_oportp(port)) sexp_flush_forced(ctx, port);
#ifndef PLAN9
    if (sexp_filenop(sexp_port_fd(port))
        && sexp_fileno_openp(sexp_port_fd(port))) {
      if (sexp_port_shutdownp(port)) {
        /* shutdown the socket if requested */
        if (sexp_iportp(port))
          shutdown(sexp_port_fileno(port), sexp_oportp(port) ? SHUT_RDWR : SHUT_RD);
        if (sexp_oportp(port))
          shutdown(sexp_port_fileno(port), SHUT_WR);
      }
      if (!sexp_port_no_closep(port)) {
        if (--sexp_fileno_count(sexp_port_fd(port)) == 0)
          sexp_finalize_fileno(ctx, self, n, sexp_port_fd(port));
      }
    }
#endif
    if (sexp_port_stream(port) && ! sexp_port_no_closep(port))
      /* close the stream */
      fclose(sexp_port_stream(port));
    sexp_port_offset(port) = 0;
    sexp_port_size(port) = 0;
  }
  return res;
}